

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Vector<double,_4> * __thiscall
math::Matrix<double,_4,_4>::col
          (Vector<double,_4> *__return_storage_ptr__,Matrix<double,_4,_4> *this,int index)

{
  double *__result;
  InterleavedIter<double,_4> local_30;
  InterleavedIter<double,_4> local_28;
  int local_1c;
  Matrix<double,_4,_4> *pMStack_18;
  int index_local;
  Matrix<double,_4,_4> *this_local;
  Vector<double,_4> *ret;
  
  local_1c = index;
  pMStack_18 = this;
  this_local = (Matrix<double,_4,_4> *)__return_storage_ptr__;
  Vector<double,_4>::Vector(__return_storage_ptr__);
  algo::InterleavedIter<double,_4>::InterleavedIter(&local_28,this->m + local_1c);
  algo::InterleavedIter<double,_4>::InterleavedIter(&local_30,this[1].m + local_1c);
  __result = Vector<double,_4>::operator*(__return_storage_ptr__);
  std::copy<math::algo::InterleavedIter<double,4>,double*>(local_28,local_30,__result);
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T,N>
Matrix<T,N,M>::col (int index) const
{
    typedef algo::InterleavedIter<T,M> RowIter;
    Vector<T,N> ret;
    std::copy(RowIter(m + index), RowIter(m + index + M * N), *ret);
    return ret;
}